

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void save_cursor(Terminal *term,_Bool save)

{
  _Bool save_local;
  Terminal *term_local;
  
  if (save) {
    term->savecurs = term->curs;
    term->save_attr = term->curr_attr;
    term->save_truecolour = term->curr_truecolour;
    term->save_cset = term->cset;
    term->save_utf = (_Bool)(term->utf & 1);
    term->save_wnext = (_Bool)(term->wrapnext & 1);
    term->save_csattr = term->cset_attr[term->cset];
    term->save_sco_acs = term->sco_acs;
  }
  else {
    term->curs = term->savecurs;
    if (term->cols <= (term->curs).x) {
      (term->curs).x = term->cols + L'\xffffffff';
    }
    if (term->rows <= (term->curs).y) {
      (term->curs).y = term->rows + L'\xffffffff';
    }
    term->curr_attr = term->save_attr;
    term->curr_truecolour = term->save_truecolour;
    term->cset = term->save_cset;
    term->utf = (_Bool)(term->save_utf & 1);
    term->wrapnext = (_Bool)(term->save_wnext & 1);
    if (((term->wrapnext & 1U) != 0) && ((term->curs).x < term->cols + L'\xffffffff')) {
      term->wrapnext = false;
    }
    term->cset_attr[term->cset] = term->save_csattr;
    term->sco_acs = term->save_sco_acs;
    set_erase_char(term);
  }
  return;
}

Assistant:

static void save_cursor(Terminal *term, bool save)
{
    if (save) {
        term->savecurs = term->curs;
        term->save_attr = term->curr_attr;
        term->save_truecolour = term->curr_truecolour;
        term->save_cset = term->cset;
        term->save_utf = term->utf;
        term->save_wnext = term->wrapnext;
        term->save_csattr = term->cset_attr[term->cset];
        term->save_sco_acs = term->sco_acs;
    } else {
        term->curs = term->savecurs;
        /* Make sure the window hasn't shrunk since the save */
        if (term->curs.x >= term->cols)
            term->curs.x = term->cols - 1;
        if (term->curs.y >= term->rows)
            term->curs.y = term->rows - 1;

        term->curr_attr = term->save_attr;
        term->curr_truecolour = term->save_truecolour;
        term->cset = term->save_cset;
        term->utf = term->save_utf;
        term->wrapnext = term->save_wnext;
        /*
         * wrapnext might reset to False if the x position is no
         * longer at the rightmost edge.
         */
        if (term->wrapnext && term->curs.x < term->cols-1)
            term->wrapnext = false;
        term->cset_attr[term->cset] = term->save_csattr;
        term->sco_acs = term->save_sco_acs;
        set_erase_char(term);
    }
}